

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O1

ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> * __thiscall
openjij::system::make_classical_ising_polynomial<openjij::graph::Polynomial<double>>
          (ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *__return_storage_ptr__,
          system *this,Spins *init_variables,Polynomial<double> *poly_graph,string *init_vartype)

{
  size_t sVar1;
  string local_48;
  
  sVar1 = (poly_graph->super_Graph)._num_spins;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,sVar1,
             (long)&(((poly_graph->poly_key_list_).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data + sVar1);
  ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::ClassicalIsingPolynomial
            (__return_storage_ptr__,(Spins *)this,(Polynomial<double> *)init_variables,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto make_classical_ising_polynomial(const graph::Spins &init_variables,
                                     const GraphType &poly_graph,
                                     const std::string init_vartype) {
  return ClassicalIsingPolynomial<graph::Polynomial<double>>(
      init_variables, poly_graph, init_vartype);
}